

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O0

void anon_unknown.dwarf_2754c4::cmExecuteProcessCommandFixText
               (vector<char,_std::allocator<char>_> *output,bool strip_trailing_whitespace)

{
  char cVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  bool local_32;
  value_type local_1e;
  char local_1d;
  uint local_1c;
  uint uStack_18;
  char c;
  uint out_index;
  uint in_index;
  bool strip_trailing_whitespace_local;
  vector<char,_std::allocator<char>_> *output_local;
  
  uStack_18 = 0;
  local_1c = 0;
  out_index._3_1_ = strip_trailing_whitespace;
  _in_index = output;
  while (uVar2 = (ulong)uStack_18, sVar3 = std::vector<char,_std::allocator<char>_>::size(_in_index)
        , uVar2 < sVar3) {
    uVar2 = (ulong)uStack_18;
    uStack_18 = uStack_18 + 1;
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](_in_index,uVar2);
    local_1d = *pvVar4;
    if ((((local_1d != '\r') ||
         (uVar2 = (ulong)uStack_18,
         sVar3 = std::vector<char,_std::allocator<char>_>::size(_in_index), sVar3 <= uVar2)) ||
        (pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](_in_index,(ulong)uStack_18),
        *pvVar4 != '\n')) && (cVar1 = local_1d, local_1d != '\0')) {
      uVar2 = (ulong)local_1c;
      local_1c = local_1c + 1;
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](_in_index,uVar2);
      *pvVar4 = cVar1;
    }
  }
  if ((out_index._3_1_ & 1) != 0) {
    while( true ) {
      local_32 = false;
      if (local_1c != 0) {
        pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                           (_in_index,(ulong)(local_1c - 1));
        local_32 = cmExecuteProcessCommandIsWhitespace(*pvVar4);
      }
      if (local_32 == false) break;
      local_1c = local_1c - 1;
    }
  }
  std::vector<char,_std::allocator<char>_>::resize(_in_index,(ulong)local_1c);
  local_1e = '\0';
  std::vector<char,_std::allocator<char>_>::push_back(_in_index,&local_1e);
  return;
}

Assistant:

void cmExecuteProcessCommandFixText(std::vector<char>& output,
                                    bool strip_trailing_whitespace)
{
  // Remove \0 characters and the \r part of \r\n pairs.
  unsigned int in_index = 0;
  unsigned int out_index = 0;
  while (in_index < output.size()) {
    char c = output[in_index++];
    if ((c != '\r' ||
         !(in_index < output.size() && output[in_index] == '\n')) &&
        c != '\0') {
      output[out_index++] = c;
    }
  }

  // Remove trailing whitespace if requested.
  if (strip_trailing_whitespace) {
    while (out_index > 0 &&
           cmExecuteProcessCommandIsWhitespace(output[out_index - 1])) {
      --out_index;
    }
  }

  // Shrink the vector to the size needed.
  output.resize(out_index);

  // Put a terminator on the text string.
  output.push_back('\0');
}